

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O1

void __thiscall
Js::FunctionBodyPolymorphicInlineCache::FunctionBodyPolymorphicInlineCache
          (FunctionBodyPolymorphicInlineCache *this,InlineCache *inlineCaches,uint16 size,
          FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined6 in_register_00000012;
  
  (this->super_PolymorphicInlineCache).inlineCaches = inlineCaches;
  (this->super_PolymorphicInlineCache).size = size;
  (this->super_PolymorphicInlineCache).ignoreForEquivalentObjTypeSpec = false;
  (this->super_PolymorphicInlineCache).cloneForJitTimeUse = true;
  (this->super_PolymorphicInlineCache).inlineCachesFillInfo = 0;
  (this->super_PolymorphicInlineCache).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014ff2b0;
  this->functionBody = functionBody;
  this->next = (FunctionBodyPolymorphicInlineCache *)0x0;
  this->prev = (FunctionBodyPolymorphicInlineCache *)0x0;
  if ((inlineCaches != (InlineCache *)0x0 || (int)CONCAT62(in_register_00000012,size) != 0) &&
     (inlineCaches == (InlineCache *)0x0 || 0x1c < (ushort)(size - 4))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                ,0x2ab,
                                "((size == 0 && inlineCaches == nullptr) || (inlineCaches != nullptr && size >= 4 && size <= 32))"
                                ,
                                "(size == 0 && inlineCaches == nullptr) || (inlineCaches != nullptr && size >= MinPolymorphicInlineCacheSize && size <= MaxPolymorphicInlineCacheSize)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

FunctionBodyPolymorphicInlineCache(InlineCache * inlineCaches, uint16 size, FunctionBody * functionBody)
            : PolymorphicInlineCache(inlineCaches, size), functionBody(functionBody), next(nullptr), prev(nullptr)
        {
            Assert((size == 0 && inlineCaches == nullptr) ||
                (inlineCaches != nullptr && size >= MinPolymorphicInlineCacheSize && size <= MaxPolymorphicInlineCacheSize));
        }